

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBblif.c
# Opt level: O0

Bbl_Man_t * Bbl_ManFromAbc(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pName;
  Bbl_Man_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Bbl_Man_t *p;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsSopLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBblif.c"
                  ,0x3c,"Bbl_Man_t *Bbl_ManFromAbc(Abc_Ntk_t *)");
  }
  pName = Abc_NtkName(pNtk);
  p_00 = Bbl_ManStart(pName);
  p_01 = Abc_NtkDfs(pNtk,0);
  for (local_34 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,local_34);
    uVar2 = Abc_ObjId(pAVar4);
    Bbl_ManCreateObject(p_00,BBL_OBJ_CI,uVar2,0,(char *)0x0);
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p_01), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_01,local_34);
    uVar2 = Abc_ObjId(pAVar4);
    iVar1 = Abc_ObjFaninNum(pAVar4);
    Bbl_ManCreateObject(p_00,BBL_OBJ_NODE,uVar2,iVar1,(char *)(pAVar4->field_5).pData);
  }
  for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = Abc_NtkCo(pNtk,local_34);
    uVar2 = Abc_ObjId(pAVar4);
    Bbl_ManCreateObject(p_00,BBL_OBJ_CO,uVar2,1,(char *)0x0);
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p_01), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_01,local_34);
    for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_38 < iVar1; local_38 = local_38 + 1) {
      pAVar5 = Abc_ObjFanin(pAVar4,local_38);
      uVar2 = Abc_ObjId(pAVar4);
      uVar3 = Abc_ObjId(pAVar5);
      Bbl_ManAddFanin(p_00,uVar2,uVar3);
    }
  }
  for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar4 = Abc_NtkCo(pNtk,local_34);
    for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pAVar4), local_38 < iVar1; local_38 = local_38 + 1) {
      pAVar5 = Abc_ObjFanin(pAVar4,local_38);
      uVar2 = Abc_ObjId(pAVar4);
      uVar3 = Abc_ObjId(pAVar5);
      Bbl_ManAddFanin(p_00,uVar2,uVar3);
    }
  }
  Vec_PtrFree(p_01);
  Bbl_ManCheck(p_00);
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


// For description of Binary BLIF format, refer to "abc/src/aig/bbl/bblif.h"

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Fnction*************************************************************

  Synopsis    [Construct manager from the ABC network.]

  Description [In the ABC network each object has a unique integer ID.
  This ID is used when we construct objects of the BBLIF manager 
  corresponding to each object of the ABC network. The objects can be
  added to the manager in any order (although below they are added in the
  topological order), but by the time fanin/fanout connections are created, 
  corresponding objects are already constructed. In the end the checking
  procedure is called.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Bbl_Man_t * Bbl_ManFromAbc( Abc_Ntk_t * pNtk )
{
    Bbl_Man_t * p;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // start the data manager
    p = Bbl_ManStart( Abc_NtkName(pNtk) );
    // collect internal nodes to be added
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // create combinational inputs
    Abc_NtkForEachCi( pNtk, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_CI, Abc_ObjId(pObj), 0, NULL );
    // create internal nodes 
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_NODE, Abc_ObjId(pObj), Abc_ObjFaninNum(pObj), (char *)pObj->pData );
    // create combinational outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Bbl_ManCreateObject( p, BBL_OBJ_CO, Abc_ObjId(pObj), 1, NULL );
    // create fanin/fanout connections for internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Bbl_ManAddFanin( p, Abc_ObjId(pObj), Abc_ObjId(pFanin) );
    // create fanin/fanout connections for combinational outputs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Bbl_ManAddFanin( p, Abc_ObjId(pObj), Abc_ObjId(pFanin) );
    Vec_PtrFree( vNodes );
    // sanity check
    Bbl_ManCheck( p );
    return p;
}